

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

normal3f tinyusdz::vnormalize(normal3f *a,float eps)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  normal3f nVar6;
  
  fVar3 = vlength(a);
  if (fVar3 <= eps) {
    fVar3 = eps;
  }
  uVar1 = a->x;
  uVar2 = a->y;
  auVar4._4_4_ = uVar2;
  auVar4._0_4_ = uVar1;
  auVar4._8_8_ = 0;
  nVar6.z = a->z / fVar3;
  auVar5._4_4_ = fVar3;
  auVar5._0_4_ = fVar3;
  auVar5._8_4_ = fVar3;
  auVar5._12_4_ = fVar3;
  auVar5 = divps(auVar4,auVar5);
  nVar6.x = (float)(int)auVar5._0_8_;
  nVar6.y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
  return nVar6;
}

Assistant:

value::normal3f vnormalize(const value::normal3f &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::normal3f({a[0] / len, a[1] / len, a[2] / len});
}